

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O2

uint __thiscall
ON_FunctionList::RemoveFunction(ON_FunctionList *this,_func_void_ON__UINT_PTR *function)

{
  void **p;
  void *pvVar1;
  bool bVar2;
  void **ppvVar3;
  void *pvVar4;
  uint uVar5;
  
  if (function == (_func_void_ON__UINT_PTR *)0x0) {
    uVar5 = 2;
  }
  else {
    bVar2 = ON_Lock::GetDefaultLock(&this->m_lock);
    uVar5 = 0;
    if (bVar2) {
      p = (void **)this->m_head;
      if (p == (void **)0x0) {
        uVar5 = 2;
      }
      else {
        pvVar1 = p[1];
        pvVar4 = *p;
        ppvVar3 = &this->m_head;
        if (*p != (void *)0x0) {
          pvVar4 = pvVar1;
          ppvVar3 = p;
        }
        *ppvVar3 = pvVar1;
        ppvVar3 = &this->m_tail;
        if (pvVar1 != (void *)0x0) {
          ppvVar3 = p + 1;
        }
        *ppvVar3 = pvVar4;
        ON_FixedSizePool::ReturnElement(&this->m_fsp,p);
        uVar5 = 1;
      }
      ON_Lock::ReturnDefaultLock(&this->m_lock);
    }
  }
  return uVar5;
}

Assistant:

unsigned int ON_FunctionList::RemoveFunction(
    void (*function)(ON__UINT_PTR)
    )
{
  if ( 0 == function)
    return 2;

  if ( false == m_lock.GetDefaultLock() )
    return 0;

  int rc = 2;
  struct tagFunctionItem* item = FindItem((struct tagFunctionItem*)m_head,function);
  if ( item )
  {
    rc = 1;
    if ( item->m_prev )
      item->m_prev = item->m_next;
    else
      m_head = item->m_next;
    if ( item->m_next )
      item->m_next = item->m_prev;
    else
      m_tail = item->m_prev;
    m_fsp.ReturnElement(item);
  }

  m_lock.ReturnDefaultLock();

  return rc;
}